

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O2

Vec_Int_t * Abc_NtkGetNodeAttributes2(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vAttrs;
  Abc_Obj_t *pNode;
  ulong uVar3;
  ulong uVar4;
  uint nCapMin;
  
  iVar1 = Abc_NtkIsDfsOrdered(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsDfsOrdered(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCut.c"
                  ,0x2a6,"Vec_Int_t *Abc_NtkGetNodeAttributes2(Abc_Ntk_t *)");
  }
  vAttrs = Vec_IntStart(pNtk->vObjs->nSize + 1);
  iVar1 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar1) {
      return vAttrs;
    }
    pNode = Abc_NtkObj(pNtk,iVar1);
    if ((((pNode != (Abc_Obj_t *)0x0) && (pNode->Id != 0)) &&
        ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) && (1 < (pNode->vFanouts).nSize)) {
      iVar2 = Abc_NodeIsMuxControlType(pNode);
      if (iVar2 == 0) {
        if ((pNtk->vTravIds).pArray == (int *)0x0) {
          nCapMin = pNtk->vObjs->nSize + 500;
          Vec_IntGrow(&pNtk->vTravIds,nCapMin);
          uVar3 = 0;
          if (0 < (int)nCapMin) {
            uVar3 = (ulong)nCapMin;
          }
          for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
            (pNtk->vTravIds).pArray[uVar4] = 0;
          }
          (pNtk->vTravIds).nSize = nCapMin;
        }
        iVar2 = pNtk->nTravIds;
        pNtk->nTravIds = iVar2 + 1;
        if (0x3ffffffe < iVar2) {
          __assert_fail("p->nTravIds < (1<<30)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                        ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
        }
        iVar2 = Abc_NtkSubDagSize_rec(pNode,vAttrs);
        if (0xf < iVar2) {
          Vec_IntWriteEntry(vAttrs,pNode->Id,1);
        }
      }
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Abc_NtkGetNodeAttributes2( Abc_Ntk_t * pNtk ) 
{
    Vec_Int_t * vAttrs;
    Abc_Obj_t * pObj;
    int i, nSize;
    assert( Abc_NtkIsDfsOrdered(pNtk) );
    vAttrs = Vec_IntStart( Abc_NtkObjNumMax(pNtk) + 1 );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        // skip no-nodes and nodes without fanouts
        if ( pObj->Id == 0 || !(Abc_ObjIsNode(pObj) && Abc_ObjFanoutNum(pObj) > 1 && !Abc_NodeIsMuxControlType(pObj)) )
            continue;
        // the node has more than one fanout - count its sub-DAG size
        Abc_NtkIncrementTravId( pNtk );
        nSize = Abc_NtkSubDagSize_rec( pObj, vAttrs );
        if ( nSize > 15 )
            Vec_IntWriteEntry( vAttrs, pObj->Id, 1 );
    }
    return vAttrs; 
}